

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O1

node_t * __thiscall
expression_tree::node<int,_expression_tree::no_caching,_expression_tree::sequential>::operator=
          (node<int,_expression_tree::no_caching,_expression_tree::sequential> *this,
          function<int_()> *f)

{
  node_impl<int> *pnVar1;
  node_impl<int> *pnVar2;
  _Any_data _Stack_38;
  code *local_28;
  
  pnVar2 = (node_impl<int> *)operator_new(0x28);
  std::function<int_()>::function((function<int_()> *)&_Stack_38,f);
  pnVar2->_vptr_node_impl = (_func_int **)&PTR__leaf_0011f320;
  std::function<int_()>::function((function<int_()> *)(pnVar2 + 1),(function<int_()> *)&_Stack_38);
  pnVar1 = (this->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
  (this->impl)._M_t.
  super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl = pnVar2;
  if (pnVar1 != (node_impl<int> *)0x0) {
    (*pnVar1->_vptr_node_impl[1])();
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  if (this->parent != (node<int,_expression_tree::no_caching,_expression_tree::sequential> *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const std::function<T ()>& f)
	{
		impl.reset(new detail::leaf<T (*)()>(f));
		
		if(parent)
		{
			parent->modified();
		}
		
		return *this;
	}